

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

bool cppcms::b64url::decode(string *input,string *output)

{
  ulong uVar1;
  uchar *begin;
  uint uVar2;
  bool bVar3;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_42;
  value_type_conflict local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  uVar1 = input->_M_string_length;
  switch((uint)uVar1 & 3) {
  case 0:
    uVar2 = (int)(uVar1 >> 2) * 3;
    break;
  case 1:
    return false;
  case 2:
    uVar2 = (int)(uVar1 >> 2) * 3 + 1;
    break;
  case 3:
    uVar2 = (int)(uVar1 >> 2) * 3 + 2;
  }
  bVar3 = -1 < (int)uVar2;
  if (0 < (int)uVar2) {
    begin = (uchar *)(input->_M_dataplus)._M_p;
    local_41 = '\0';
    std::vector<char,_std::allocator<char>_>::vector(&local_40,(ulong)uVar2,&local_41,&local_42);
    decode(begin,begin + uVar1,
           (uchar *)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_replace
              ((ulong)output,0,(char *)output->_M_string_length,
               (ulong)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    if ((uchar *)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CPPCMS_API decode(std::string const &input,std::string &output)
{
	int ds = decoded_size(input.size());
	if(ds < 0)
		return false;
	if(ds == 0)
		return true;
	unsigned char const *begin = reinterpret_cast<unsigned char const *>(input.c_str());
	unsigned char const *end = begin + input.size();
	std::vector<char> buf(ds,0);
	unsigned char *outbuf =  reinterpret_cast<unsigned char *>(&buf[0]);
	decode(begin,end,outbuf);
	output.assign(&buf[0],ds);
	return true;
}